

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_awaiter.hxx
# Opt level: O2

void __thiscall nuraft::EventAwaiter::wait_us(EventAwaiter *this,size_t time_us)

{
  bool bVar1;
  AS expected;
  unique_lock<std::mutex> l;
  duration<long,_std::ratio<1L,_1000000L>_> local_18;
  
  expected = idle;
  bVar1 = std::atomic<nuraft::EventAwaiter::AS>::compare_exchange_strong
                    (&this->status,&expected,ready,memory_order_seq_cst);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock(&l,&this->cvLock);
    expected = ready;
    bVar1 = std::atomic<nuraft::EventAwaiter::AS>::compare_exchange_strong
                      (&this->status,&expected,waiting,memory_order_seq_cst);
    if (bVar1) {
      if (time_us == 0) {
        std::condition_variable::wait((unique_lock *)&this->cv);
      }
      else {
        local_18.__r = time_us;
        std::condition_variable::wait_for<long,std::ratio<1l,1000000l>>(&this->cv,&l,&local_18);
      }
      LOCK();
      (this->status)._M_i = done;
      UNLOCK();
    }
    std::unique_lock<std::mutex>::~unique_lock(&l);
  }
  return;
}

Assistant:

void wait_us(size_t time_us) {
        AS expected = AS::idle;
        if (status.compare_exchange_strong(expected, AS::ready)) {
            // invoke() has not been invoked yet, wait for it.
            std::unique_lock<std::mutex> l(cvLock);
            expected = AS::ready;
            if (status.compare_exchange_strong(expected, AS::waiting)) {
                if (time_us) {
                    cv.wait_for(l, std::chrono::microseconds(time_us));
                } else {
                    cv.wait(l);
                }
                status.store(AS::done);
            } else {
                // invoke() has grabbed `cvLock` earlier than this.
            }
        } else {
            // invoke() already has been called earlier than this.
        }
    }